

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

Vec_Str_t * Abc_SclProduceGenlibStrSimple(SC_Lib *p)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  Vec_Str_t *pVVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  int i_4;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  int i;
  long lVar14;
  long lVar15;
  size_t sVar16;
  char Buffer [200];
  char local_f8 [200];
  
  pVVar7 = (Vec_Str_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  pcVar8 = (char *)malloc(1000);
  pVVar7->pArray = pcVar8;
  lVar14 = 0;
  do {
    cVar1 = "GATE _const0_            0.00 z=CONST0;\n"[lVar14];
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        sVar13 = 0x10;
      }
      else {
        sVar13 = (ulong)uVar2 * 2;
        if ((int)sVar13 <= (int)uVar2) goto LAB_0047013d;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar13);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar13);
        }
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = (int)sVar13;
    }
LAB_0047013d:
    iVar3 = pVVar7->nSize;
    pVVar7->nSize = iVar3 + 1;
    pVVar7->pArray[iVar3] = cVar1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x28);
  lVar14 = 0;
  do {
    cVar1 = "GATE _const1_            0.00 z=CONST1;\n"[lVar14];
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        sVar13 = 0x10;
      }
      else {
        sVar13 = (ulong)uVar2 * 2;
        if ((int)sVar13 <= (int)uVar2) goto LAB_004701cb;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar13);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar13);
        }
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = (int)sVar13;
    }
LAB_004701cb:
    iVar3 = pVVar7->nSize;
    pVVar7->nSize = iVar3 + 1;
    pVVar7->pArray[iVar3] = cVar1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x28);
  if (0 < (p->vCells).nSize) {
    lVar14 = 0;
    do {
      puVar5 = (undefined8 *)(p->vCells).pArray[lVar14];
      uVar2 = *(uint *)(puVar5 + 8);
      uVar10 = (ulong)uVar2;
      if (uVar10 != 0) {
        sVar13 = strlen((char *)*puVar5);
        if (199 < sVar13) {
          __assert_fail("strlen(pCell->pName) < 200",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibUtil.c"
                        ,0x32c,"Vec_Str_t *Abc_SclProduceGenlibStrSimple(SC_Lib *)");
        }
        if ((int)uVar2 < *(int *)((long)puVar5 + 0x34)) {
          do {
            if ((int)uVar2 < 0) {
LAB_00470b81:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            puVar6 = *(undefined8 **)(puVar5[7] + uVar10 * 8);
            lVar15 = 0;
            do {
              cVar1 = "GATE "[lVar15];
              uVar4 = pVVar7->nCap;
              if (pVVar7->nSize == uVar4) {
                if ((int)uVar4 < 0x10) {
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                  }
                  sVar13 = 0x10;
                }
                else {
                  sVar13 = (ulong)uVar4 * 2;
                  if ((int)sVar13 <= (int)uVar4) goto LAB_004702d3;
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(sVar13);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,sVar13);
                  }
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)sVar13;
              }
LAB_004702d3:
              iVar3 = pVVar7->nSize;
              pVVar7->nSize = iVar3 + 1;
              pVVar7->pArray[iVar3] = cVar1;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 5);
            sprintf(local_f8,"%-16s",*puVar5);
            sVar13 = strlen(local_f8);
            if (0 < (int)(uint)sVar13) {
              uVar12 = 0;
              do {
                cVar1 = local_f8[uVar12];
                uVar4 = pVVar7->nCap;
                if (pVVar7->nSize == uVar4) {
                  if ((int)uVar4 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    sVar16 = 0x10;
                  }
                  else {
                    sVar16 = (ulong)uVar4 * 2;
                    if ((int)sVar16 <= (int)uVar4) goto LAB_00470390;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(sVar16);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,sVar16);
                    }
                  }
                  pVVar7->pArray = pcVar8;
                  pVVar7->nCap = (int)sVar16;
                }
LAB_00470390:
                iVar3 = pVVar7->nSize;
                pVVar7->nSize = iVar3 + 1;
                pVVar7->pArray[iVar3] = cVar1;
                uVar12 = uVar12 + 1;
              } while (((uint)sVar13 & 0x7fffffff) != uVar12);
            }
            uVar4 = pVVar7->nCap;
            if (pVVar7->nSize == uVar4) {
              if ((int)uVar4 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                }
                sVar13 = 0x10;
              }
              else {
                sVar13 = (ulong)uVar4 * 2;
                if ((int)sVar13 <= (int)uVar4) goto LAB_00470413;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar13);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,sVar13);
                }
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = (int)sVar13;
            }
LAB_00470413:
            iVar3 = pVVar7->nSize;
            pVVar7->nSize = iVar3 + 1;
            pVVar7->pArray[iVar3] = ' ';
            sprintf(local_f8,"%7.2f",SUB84((double)*(float *)(puVar5 + 3),0));
            sVar13 = strlen(local_f8);
            if (0 < (int)(uint)sVar13) {
              uVar12 = 0;
              do {
                cVar1 = local_f8[uVar12];
                uVar4 = pVVar7->nCap;
                if (pVVar7->nSize == uVar4) {
                  if ((int)uVar4 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    sVar16 = 0x10;
                  }
                  else {
                    sVar16 = (ulong)uVar4 * 2;
                    if ((int)sVar16 <= (int)uVar4) goto LAB_004704bf;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(sVar16);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,sVar16);
                    }
                  }
                  pVVar7->pArray = pcVar8;
                  pVVar7->nCap = (int)sVar16;
                }
LAB_004704bf:
                iVar3 = pVVar7->nSize;
                pVVar7->nSize = iVar3 + 1;
                pVVar7->pArray[iVar3] = cVar1;
                uVar12 = uVar12 + 1;
              } while (((uint)sVar13 & 0x7fffffff) != uVar12);
            }
            uVar4 = pVVar7->nCap;
            if (pVVar7->nSize == uVar4) {
              if ((int)uVar4 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                }
                sVar13 = 0x10;
              }
              else {
                sVar13 = (ulong)uVar4 * 2;
                if ((int)sVar13 <= (int)uVar4) goto LAB_00470542;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar13);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,sVar13);
                }
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = (int)sVar13;
            }
LAB_00470542:
            iVar3 = pVVar7->nSize;
            pVVar7->nSize = iVar3 + 1;
            pVVar7->pArray[iVar3] = ' ';
            pcVar8 = (char *)*puVar6;
            sVar13 = strlen(pcVar8);
            if (0 < (int)(uint)sVar13) {
              uVar12 = 0;
              do {
                cVar1 = pcVar8[uVar12];
                uVar4 = pVVar7->nCap;
                if (pVVar7->nSize == uVar4) {
                  if ((int)uVar4 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar9 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar9 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    sVar16 = 0x10;
                  }
                  else {
                    sVar16 = (ulong)uVar4 * 2;
                    if ((int)sVar16 <= (int)uVar4) goto LAB_004705e4;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar9 = (char *)malloc(sVar16);
                    }
                    else {
                      pcVar9 = (char *)realloc(pVVar7->pArray,sVar16);
                    }
                  }
                  pVVar7->pArray = pcVar9;
                  pVVar7->nCap = (int)sVar16;
                }
LAB_004705e4:
                iVar3 = pVVar7->nSize;
                pVVar7->nSize = iVar3 + 1;
                pVVar7->pArray[iVar3] = cVar1;
                uVar12 = uVar12 + 1;
              } while (((uint)sVar13 & 0x7fffffff) != uVar12);
            }
            uVar4 = pVVar7->nCap;
            if (pVVar7->nSize == uVar4) {
              if ((int)uVar4 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                }
                sVar13 = 0x10;
              }
              else {
                sVar13 = (ulong)uVar4 * 2;
                if ((int)sVar13 <= (int)uVar4) goto LAB_00470667;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar13);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,sVar13);
                }
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = (int)sVar13;
            }
LAB_00470667:
            iVar3 = pVVar7->nSize;
            pVVar7->nSize = iVar3 + 1;
            pVVar7->pArray[iVar3] = '=';
            pcVar8 = (char *)puVar6[5];
            if (pcVar8 == (char *)0x0) {
              pcVar8 = "?";
            }
            sVar13 = strlen(pcVar8);
            if (0 < (int)(uint)sVar13) {
              uVar12 = 0;
              do {
                cVar1 = pcVar8[uVar12];
                uVar4 = pVVar7->nCap;
                if (pVVar7->nSize == uVar4) {
                  if ((int)uVar4 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar9 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar9 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    sVar16 = 0x10;
                  }
                  else {
                    sVar16 = (ulong)uVar4 * 2;
                    if ((int)sVar16 <= (int)uVar4) goto LAB_0047070f;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar9 = (char *)malloc(sVar16);
                    }
                    else {
                      pcVar9 = (char *)realloc(pVVar7->pArray,sVar16);
                    }
                  }
                  pVVar7->pArray = pcVar9;
                  pVVar7->nCap = (int)sVar16;
                }
LAB_0047070f:
                iVar3 = pVVar7->nSize;
                pVVar7->nSize = iVar3 + 1;
                pVVar7->pArray[iVar3] = cVar1;
                uVar12 = uVar12 + 1;
              } while (((uint)sVar13 & 0x7fffffff) != uVar12);
            }
            lVar15 = 0;
            do {
              cVar1 = " .%s(%s) ) ;\n"[lVar15 + 0xb];
              uVar4 = pVVar7->nCap;
              if (pVVar7->nSize == uVar4) {
                if ((int)uVar4 < 0x10) {
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                  }
                  sVar13 = 0x10;
                }
                else {
                  sVar13 = (ulong)uVar4 * 2;
                  if ((int)sVar13 <= (int)uVar4) goto LAB_0047079c;
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(sVar13);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,sVar13);
                  }
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)sVar13;
              }
LAB_0047079c:
              iVar3 = pVVar7->nSize;
              pVVar7->nSize = iVar3 + 1;
              pVVar7->pArray[iVar3] = cVar1;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 2);
            if (0 < *(int *)(puVar5 + 8)) {
              lVar15 = 0;
              do {
                if (*(int *)((long)puVar5 + 0x34) <= lVar15) goto LAB_00470b81;
                puVar6 = *(undefined8 **)(puVar5[7] + lVar15 * 8);
                lVar11 = 0;
                do {
                  cVar1 = "         PIN "[lVar11];
                  uVar4 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar4) {
                    if ((int)uVar4 < 0x10) {
                      if (pVVar7->pArray == (char *)0x0) {
                        pcVar8 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                      }
                      sVar13 = 0x10;
                    }
                    else {
                      sVar13 = (ulong)uVar4 * 2;
                      if ((int)sVar13 <= (int)uVar4) goto LAB_0047084c;
                      if (pVVar7->pArray == (char *)0x0) {
                        pcVar8 = (char *)malloc(sVar13);
                      }
                      else {
                        pcVar8 = (char *)realloc(pVVar7->pArray,sVar13);
                      }
                    }
                    pVVar7->pArray = pcVar8;
                    pVVar7->nCap = (int)sVar13;
                  }
LAB_0047084c:
                  iVar3 = pVVar7->nSize;
                  pVVar7->nSize = iVar3 + 1;
                  pVVar7->pArray[iVar3] = cVar1;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 0xd);
                sprintf(local_f8,"%-4s",*puVar6);
                sVar13 = strlen(local_f8);
                if (0 < (int)(uint)sVar13) {
                  uVar12 = 0;
                  do {
                    cVar1 = local_f8[uVar12];
                    uVar4 = pVVar7->nCap;
                    if (pVVar7->nSize == uVar4) {
                      if ((int)uVar4 < 0x10) {
                        if (pVVar7->pArray == (char *)0x0) {
                          pcVar8 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                        }
                        sVar16 = 0x10;
                      }
                      else {
                        sVar16 = (ulong)uVar4 * 2;
                        if ((int)sVar16 <= (int)uVar4) goto LAB_00470908;
                        if (pVVar7->pArray == (char *)0x0) {
                          pcVar8 = (char *)malloc(sVar16);
                        }
                        else {
                          pcVar8 = (char *)realloc(pVVar7->pArray,sVar16);
                        }
                      }
                      pVVar7->pArray = pcVar8;
                      pVVar7->nCap = (int)sVar16;
                    }
LAB_00470908:
                    iVar3 = pVVar7->nSize;
                    pVVar7->nSize = iVar3 + 1;
                    pVVar7->pArray[iVar3] = cVar1;
                    uVar12 = uVar12 + 1;
                  } while (((uint)sVar13 & 0x7fffffff) != uVar12);
                }
                builtin_strncpy(local_f8 + 0x20,"00  0.00\n",10);
                builtin_strncpy(local_f8 + 0x10,"  1.00  0.00  1.",0x10);
                builtin_strncpy(local_f8," UNKNOWN  1  999",0x10);
                sVar13 = strlen(local_f8);
                if (0 < (int)(uint)sVar13) {
                  uVar12 = 0;
                  do {
                    cVar1 = local_f8[uVar12];
                    uVar4 = pVVar7->nCap;
                    if (pVVar7->nSize == uVar4) {
                      if ((int)uVar4 < 0x10) {
                        if (pVVar7->pArray == (char *)0x0) {
                          pcVar8 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                        }
                        sVar16 = 0x10;
                      }
                      else {
                        sVar16 = (ulong)uVar4 * 2;
                        if ((int)sVar16 <= (int)uVar4) goto LAB_004709d0;
                        if (pVVar7->pArray == (char *)0x0) {
                          pcVar8 = (char *)malloc(sVar16);
                        }
                        else {
                          pcVar8 = (char *)realloc(pVVar7->pArray,sVar16);
                        }
                      }
                      pVVar7->pArray = pcVar8;
                      pVVar7->nCap = (int)sVar16;
                    }
LAB_004709d0:
                    iVar3 = pVVar7->nSize;
                    pVVar7->nSize = iVar3 + 1;
                    pVVar7->pArray[iVar3] = cVar1;
                    uVar12 = uVar12 + 1;
                  } while (((uint)sVar13 & 0x7fffffff) != uVar12);
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < *(int *)(puVar5 + 8));
            }
            uVar10 = uVar10 + 1;
          } while ((int)uVar10 < *(int *)((long)puVar5 + 0x34));
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vCells).nSize);
  }
  lVar14 = 0;
  do {
    cVar1 = "\n.end\n"[lVar14];
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        sVar13 = 0x10;
      }
      else {
        sVar13 = (ulong)uVar2 * 2;
        if ((int)sVar13 <= (int)uVar2) goto LAB_00470ad0;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar13);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar13);
        }
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = (int)sVar13;
    }
LAB_00470ad0:
    iVar3 = pVVar7->nSize;
    pVVar7->nSize = iVar3 + 1;
    pVVar7->pArray[iVar3] = cVar1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 6);
  uVar2 = pVVar7->nCap;
  if (pVVar7->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar7->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
      }
      sVar13 = 0x10;
    }
    else {
      sVar13 = (ulong)uVar2 * 2;
      if ((int)sVar13 <= (int)uVar2) goto LAB_00470b50;
      if (pVVar7->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar13);
      }
      else {
        pcVar8 = (char *)realloc(pVVar7->pArray,sVar13);
      }
    }
    pVVar7->pArray = pcVar8;
    pVVar7->nCap = (int)sVar13;
  }
LAB_00470b50:
  iVar3 = pVVar7->nSize;
  pVVar7->nSize = iVar3 + 1;
  pVVar7->pArray[iVar3] = '\0';
  return pVVar7;
}

Assistant:

Vec_Str_t * Abc_SclProduceGenlibStrSimple( SC_Lib * p )
{
    char Buffer[200];
    Vec_Str_t * vStr;
    SC_Cell * pCell;
    SC_Pin * pPin, * pPinOut;
    int i, j, k, Count = 2;
    // mark skipped cells
//    Abc_SclMarkSkippedCells( p );
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE _const0_            0.00 z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE _const1_            0.00 z=CONST1;\n" );
    SC_LibForEachCell( p, pCell, i )
    {
        if ( pCell->n_inputs == 0 )
            continue;
        assert( strlen(pCell->pName) < 200 );
        SC_CellForEachPinOut( pCell, pPinOut, j )
        {
            Vec_StrPrintStr( vStr, "GATE " );
            sprintf( Buffer, "%-16s", pCell->pName );
            Vec_StrPrintStr( vStr, Buffer );
            Vec_StrPrintStr( vStr, " " );
            sprintf( Buffer, "%7.2f", pCell->area );
            Vec_StrPrintStr( vStr, Buffer );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, pPinOut->pName );
            Vec_StrPrintStr( vStr, "=" );
            Vec_StrPrintStr( vStr, pPinOut->func_text ? pPinOut->func_text : "?" );
            Vec_StrPrintStr( vStr, ";\n" );
            SC_CellForEachPinIn( pCell, pPin, k )
            {
                Vec_StrPrintStr( vStr, "         PIN " );
                sprintf( Buffer, "%-4s", pPin->pName );
                Vec_StrPrintStr( vStr, Buffer );
                sprintf( Buffer, " UNKNOWN  1  999  1.00  0.00  1.00  0.00\n" );
                Vec_StrPrintStr( vStr, Buffer );
            }
            Count++;
        }
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "GENLIB library with %d gates is produced:\n", Count );
//    printf( "%s", Vec_StrArray(vStr) );
    return vStr;
}